

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NKmerIndex.cc
# Opt level: O1

void __thiscall
NKmerIndex::NKmerIndex
          (NKmerIndex *this,SequenceDistanceGraph *_sg,uint8_t k,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *whitelist)

{
  byte *pbVar1;
  array<char,_256UL> *__s;
  array<char,_256UL> *__s_00;
  pointer pkVar2;
  pointer ppVar3;
  value_type_conflict7 *__val;
  pointer __s_01;
  size_type *psVar4;
  size_type sVar5;
  pointer pkVar6;
  runtime_error *this_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  pair<bool,_unsigned_long> *kmer;
  pointer ppVar11;
  pointer pNVar12;
  int iVar13;
  int iVar14;
  vector<kmerPos,_std::allocator<kmerPos>_> local_kmers;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  contig_kmers;
  StringKMerFactory skf;
  vector<kmerPos,_std::allocator<kmerPos>_> local_2b8;
  vector<kmerPos,std::allocator<kmerPos>> *local_2a0;
  ulong local_298;
  int local_28c;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> local_288
  ;
  ulong local_268;
  StringKMerFactory local_260;
  
  (this->bfilter).estimated_size = 0x4600000;
  (this->bfilter).numHashes = 1;
  (this->bfilter).dataSz = 8;
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s_01 = (pointer)operator_new(0x8c0000);
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s_01;
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s_01;
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s_01 + 0x8c0000;
  memset(__s_01,0,0x8c0000);
  (this->bfilter).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s_01 + 0x8c0000;
  local_2a0 = (vector<kmerPos,std::allocator<kmerPos>> *)&this->assembly_kmers;
  (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->k = k;
  this->sg = _sg;
  if (0x1f < k) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"You are trying to use K>31, which is not supported by NKmerIndex");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pNVar12 = (_sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = ((long)(_sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pNVar12 >> 3) * 0x6db6db6db6db6db7;
  if (uVar7 < 2) {
    uVar7 = 0;
  }
  else {
    lVar8 = uVar7 - 1;
    psVar4 = &pNVar12[1].sequence._M_string_length;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + *psVar4;
      psVar4 = psVar4 + 7;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  std::vector<kmerPos,_std::allocator<kmerPos>_>::reserve
            ((vector<kmerPos,_std::allocator<kmerPos>_> *)local_2a0,uVar7);
  __s = &local_260.super_KMerFactory.b2f;
  local_268 = (ulong)k;
  local_260.super_KMerFactory.KMER_MASK = ~(-1L << ((byte)((uint)k * 2) & 0x3f));
  local_260.super_KMerFactory.last_unknown = 0;
  local_260.super_KMerFactory.fkmer = 0;
  local_260.super_KMerFactory.rkmer = 0;
  local_260.super_KMerFactory.KMER_FIRSTOFFSET = (ulong)((uint)k * 2) - 2;
  local_260.super_KMerFactory.K = k;
  memset(__s,0,0x100);
  local_260.super_KMerFactory.b2f._M_elems[0] = '\x04';
  __s_00 = &local_260.super_KMerFactory.b2r;
  memset(__s_00,0,0x100);
  memset(__s,4,0xff);
  memset(__s_00,4,0xff);
  local_260.super_KMerFactory.b2f._M_elems[0x41] = '\0';
  local_260.super_KMerFactory.b2f._M_elems[0x61] = '\0';
  local_260.super_KMerFactory.b2f._M_elems[0x43] = '\x01';
  local_260.super_KMerFactory.b2f._M_elems[99] = '\x01';
  local_260.super_KMerFactory.b2f._M_elems[0x47] = '\x02';
  local_260.super_KMerFactory.b2f._M_elems[0x67] = '\x02';
  local_260.super_KMerFactory.b2f._M_elems[0x54] = '\x03';
  local_260.super_KMerFactory.b2f._M_elems[0x74] = '\x03';
  local_260.super_KMerFactory.b2r._M_elems[0x41] = '\x03';
  local_260.super_KMerFactory.b2r._M_elems[0x61] = '\x03';
  local_260.super_KMerFactory.b2r._M_elems[0x43] = '\x02';
  local_260.super_KMerFactory.b2r._M_elems[99] = '\x02';
  local_260.super_KMerFactory.b2r._M_elems[0x47] = '\x01';
  local_260.super_KMerFactory.b2r._M_elems[0x67] = '\x01';
  local_260.super_KMerFactory.b2r._M_elems[0x54] = '\0';
  local_260.super_KMerFactory.b2r._M_elems[0x74] = '\0';
  local_260.super_KMerFactory.last_unknown = 0;
  local_260.super_KMerFactory.fkmer = 0;
  local_260.super_KMerFactory.rkmer = 0;
  local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<kmerPos,_std::allocator<kmerPos>_>::reserve(&local_2b8,uVar7 >> 2);
  local_288.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  reserve(&local_288,10000000);
  local_298 = 1;
  pNVar12 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar12 >> 3) *
                 0x6db6db6db6db6db7)) {
    do {
      if (local_268 <= pNVar12[local_298].sequence._M_string_length) {
        if (local_288.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_288.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_288.
          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_288.
               super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        StringKMerFactory::create_kmers(&local_260,&pNVar12[local_298].sequence,&local_288);
        ppVar3 = local_288.
                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_288.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_288.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar14 = 1;
          iVar13 = -1;
          ppVar11 = local_288.
                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            sVar5 = std::
                    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&whitelist->_M_h,&ppVar11->second);
            if (sVar5 != 0) {
              local_28c = iVar13;
              if (ppVar11->first != false) {
                local_28c = iVar14;
              }
              std::vector<kmerPos,std::allocator<kmerPos>>::
              emplace_back<unsigned_long_const&,long&,int>
                        ((vector<kmerPos,std::allocator<kmerPos>> *)&local_2b8,&ppVar11->second,
                         (long *)&local_298,&local_28c);
            }
            ppVar11 = ppVar11 + 1;
            iVar14 = iVar14 + 1;
            iVar13 = iVar13 + -1;
          } while (ppVar11 != ppVar3);
        }
      }
      if ((12800000000 <
           (ulong)((long)local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                        super__Vector_impl_data._M_start)) &&
         (std::vector<kmerPos,std::allocator<kmerPos>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>>
                    (local_2a0,
                     (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>.
                     _M_impl.super__Vector_impl_data._M_finish),
         local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
         super__Vector_impl_data._M_start)) {
        local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_298 = local_298 + 1;
      pNVar12 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_298 <
             (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pNVar12 >> 3) *
                    0x6db6db6db6db6db7));
  }
  if ((local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (std::vector<kmerPos,std::allocator<kmerPos>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>>
                (local_2a0),
     local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data
     ._M_finish !=
     local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data
     ._M_start)) {
    local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_288.
      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.
                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pkVar6 = (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
           super__Vector_impl_data._M_start;
  pkVar2 = (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pkVar6 != pkVar2) {
    uVar7 = (long)pkVar2 - (long)pkVar6 >> 4;
    lVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kmerPos::byKmerContigOffset>>
              (pkVar6,pkVar2,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,__gnu_cxx::__ops::_Iter_comp_iter<kmerPos::byKmerContigOffset>>
              ();
  }
  pkVar6 = (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
      super__Vector_impl_data._M_finish != pkVar6) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      uVar10 = *(ulong *)((long)&pkVar6->kmer + lVar8) % (this->bfilter).estimated_size;
      uVar9 = (ulong)(this->bfilter).dataSz;
      pbVar1 = (this->bfilter).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar10 / uVar9;
      *pbVar1 = *pbVar1 | (byte)(1 << (7U - (char)(uVar10 % uVar9) & 0x1f));
      uVar7 = uVar7 + 1;
      pkVar6 = (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->assembly_kmers).
                                   super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pkVar6 >> 4));
  }
  return;
}

Assistant:

NKmerIndex::NKmerIndex(const SequenceDistanceGraph &_sg, uint8_t k, std::unordered_set<uint64_t> whitelist):
        k(k), bfilter(70*1024*1024), sg(_sg){
    if (k > 31) {
        throw std::runtime_error("You are trying to use K>31, which is not supported by NKmerIndex");
    }
    uint64_t total_length=0;
#pragma omp parallel for reduction(+:total_length)
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        total_length+=sg.nodes[n].sequence.size();
    }
    assembly_kmers.reserve(total_length);
#pragma omp parallel
    {
        StringKMerFactory skf(k);
        std::vector<kmerPos> local_kmers;
        local_kmers.reserve(total_length/(omp_get_num_threads()*4));
        std::vector<std::pair<bool,uint64_t > > contig_kmers;
        contig_kmers.reserve(10000000);
#pragma omp for
        for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
            if (sg.nodes[n].sequence.size() >= k) {
                contig_kmers.clear();
                skf.create_kmers(sg.nodes[n].sequence, contig_kmers);
                int k_i(0);
                for (const auto &kmer:contig_kmers) {
                    if (whitelist.count(kmer.second)) local_kmers.emplace_back(kmer.second, n, kmer.first ? k_i + 1 : -(k_i + 1));

                    k_i++;
                }
            }

            if (local_kmers.size() > 800000000) {
#pragma omp critical(push_kmers)
                {
                    assembly_kmers.insert(assembly_kmers.end(), local_kmers.begin(), local_kmers.end());
                }
                local_kmers.clear();
            }
        }
        if (!local_kmers.empty()) {
#pragma omp critical(push_kmers)
            {
                assembly_kmers.insert(assembly_kmers.end(), local_kmers.begin(), local_kmers.end());
            }
            local_kmers.clear();
        }
    }
    sdglib::sort(assembly_kmers.begin(),assembly_kmers.end(), kmerPos::byKmerContigOffset());

#pragma omp parallel for
    for (uint64_t kidx = 0; kidx < assembly_kmers.size(); ++kidx) {
        bfilter.add(assembly_kmers[kidx].kmer);
    }
}